

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.cpp
# Opt level: O2

QString * Mustache::Renderer::readTagName
                    (QString *__return_storage_ptr__,QString *content,int pos,int endPos)

{
  char16_t *pcVar1;
  bool bVar2;
  char16_t cVar3;
  long lVar4;
  
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  QString::reserve(__return_storage_ptr__,(long)(endPos - pos));
  pcVar1 = (content->d).ptr;
  lVar4 = (long)pos + -1;
  do {
    cVar3 = pcVar1[lVar4 + 1];
    bVar2 = QChar::isSpace((uint)(ushort)cVar3);
    lVar4 = lVar4 + 1;
  } while (bVar2);
  while( true ) {
    bVar2 = QChar::isSpace((uint)(ushort)cVar3);
    if ((endPos <= lVar4) || (bVar2)) break;
    QString::append((QChar)(char16_t)__return_storage_ptr__);
    cVar3 = (content->d).ptr[lVar4 + 1];
    lVar4 = lVar4 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

QString Renderer::readTagName(const QString& content, int pos, int endPos)
{
	QString name;
	name.reserve(endPos - pos);
	while (content.at(pos).isSpace()) {
		++pos;
	}
	while (!content.at(pos).isSpace() && pos < endPos) {
		name += content.at(pos);
		++pos;
	}
	return name;
}